

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

ostream * nuraft::operator<<(ostream *out,buffer *buf)

{
  ostream *poVar1;
  ulong uVar2;
  byte *pbVar3;
  error_code *this;
  char *pcVar4;
  buffer *in_RSI;
  ostream *in_RDI;
  undefined8 in_stack_ffffffffffffff88;
  error_code *in_stack_ffffffffffffff90;
  undefined1 local_40 [48];
  buffer *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar2 = std::ios::operator!((ios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  poVar1 = local_8;
  if ((uVar2 & 1) != 0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffff90,(io_errc)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)"bad output stream.");
    __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  pbVar3 = buffer::data(local_10);
  this = (error_code *)buffer::size(local_10);
  buffer::pos(local_10);
  std::ostream::write((char *)poVar1,(long)pbVar3);
  uVar2 = std::ios::operator!((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if ((uVar2 & 1) == 0) {
    return local_8;
  }
  pcVar4 = (char *)__cxa_allocate_exception(0x20);
  std::error_code::error_code<std::io_errc,void>(this,(io_errc)((ulong)local_40 >> 0x20));
  std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)"write failed");
  __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

std::ostream& nuraft::operator << (std::ostream& out, buffer& buf) {
    if (!out) {
        throw std::ios::failure("bad output stream.");
    }

    out.write(reinterpret_cast<char*>(buf.data()), buf.size() - buf.pos());

    if (!out) {
        throw std::ios::failure("write failed");
    }

    return out;
}